

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall
cmOrderDirectoriesConstraint::FindConflicts(cmOrderDirectoriesConstraint *this,uint index)

{
  cmOrderDirectories *this_00;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  value_type in_RAX;
  uint uVar4;
  ulong uVar5;
  string *l;
  ConflictPair p;
  value_type local_38;
  
  uVar4 = 0;
  local_38 = in_RAX;
  while( true ) {
    uVar5 = (ulong)uVar4;
    this_00 = this->OD;
    pbVar1 = (this_00->OriginalDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this_00->OriginalDirectories).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5)
    break;
    l = pbVar1 + uVar5;
    bVar2 = cmOrderDirectories::IsSameDirectory(this_00,l,&this->Directory);
    if (!bVar2) {
      iVar3 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,l);
      if ((char)iVar3 != '\0') {
        local_38.second = index;
        local_38.first = this->DirectoryIndex;
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (&(this->OD->ConflictGraph).
                    super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar5].
                    super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,
                   &local_38);
      }
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void FindConflicts(unsigned int index)
    {
    for(unsigned int i=0; i < this->OD->OriginalDirectories.size(); ++i)
      {
      // Check if this directory conflicts with the entry.
      std::string const& dir = this->OD->OriginalDirectories[i];
      if (!this->OD->IsSameDirectory(dir, this->Directory) &&
          this->FindConflict(dir))
        {
        // The library will be found in this directory but this is not
        // the directory named for it.  Add an entry to make sure the
        // desired directory comes before this one.
        cmOrderDirectories::ConflictPair p(this->DirectoryIndex, index);
        this->OD->ConflictGraph[i].push_back(p);
        }
      }
    }